

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O1

double SSIMGetClipped_C(uint8_t *src1,int stride1,uint8_t *src2,int stride2,int xo,int yo,int W,
                       int H)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  int iVar6;
  undefined4 in_register_0000008c;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  undefined1 local_78 [8];
  uint32_t uStack_70;
  uint32_t uStack_6c;
  undefined8 local_68;
  ulong local_58;
  undefined8 local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_50 = CONCAT44(in_register_0000008c,yo);
  stack0xffffffffffffff8c = SUB1612((undefined1  [16])0x0,4);
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  uVar8 = 3;
  if (3 < yo) {
    uVar8 = yo;
  }
  iVar6 = uVar8 - 3;
  iVar7 = H + -1;
  if (yo + 3 < H + -1) {
    iVar7 = yo + 3;
  }
  local_78._0_4_ = 0;
  if (iVar6 <= iVar7) {
    iVar3 = W + -1;
    if (xo + 3 < W + -1) {
      iVar3 = xo + 3;
    }
    local_58 = 3;
    if (3 < xo) {
      local_58 = (ulong)(uint)xo;
    }
    puVar4 = src2 + iVar6 * stride2;
    puVar5 = src1 + iVar6 * stride1;
    local_38 = (long)stride1;
    local_40 = (long)stride2;
    local_78._4_4_ = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    local_48 = (long)iVar7;
    local_78._0_4_ = 0;
    lVar10 = (ulong)uVar8 - 3;
    do {
      if ((int)local_58 + -3 <= iVar3) {
        uVar9 = local_58;
        do {
          iVar7 = kWeight[(int)uVar9 - xo] * kWeight[((int)lVar10 - yo) + 3];
          bVar1 = puVar4[uVar9 - 3];
          local_78._0_4_ = local_78._0_4_ + iVar7;
          iVar6 = iVar7 * (uint)puVar5[uVar9 - 3];
          iVar7 = iVar7 * (uint)bVar1;
          local_78._4_4_ = local_78._4_4_ + iVar6;
          uStack_70 = uStack_70 + iVar7;
          uStack_6c = uStack_6c + (uint)puVar5[uVar9 - 3] * iVar6;
          local_68._0_4_ = (uint32_t)local_68 + iVar6 * (uint)bVar1;
          local_68._4_4_ = local_68._4_4_ + iVar7 * (uint)bVar1;
          uVar9 = uVar9 + 1;
        } while (iVar3 + 4 != (int)uVar9);
      }
      puVar5 = puVar5 + local_38;
      puVar4 = puVar4 + local_40;
      bVar2 = lVar10 < local_48;
      lVar10 = lVar10 + 1;
    } while (bVar2);
  }
  dVar11 = VP8SSIMFromStatsClipped((VP8DistoStats *)local_78);
  return dVar11;
}

Assistant:

static double SSIMGetClipped_C(const uint8_t* src1, int stride1,
                               const uint8_t* src2, int stride2,
                               int xo, int yo, int W, int H) {
  VP8DistoStats stats = { 0, 0, 0, 0, 0, 0 };
  const int ymin = (yo - VP8_SSIM_KERNEL < 0) ? 0 : yo - VP8_SSIM_KERNEL;
  const int ymax = (yo + VP8_SSIM_KERNEL > H - 1) ? H - 1
                                                  : yo + VP8_SSIM_KERNEL;
  const int xmin = (xo - VP8_SSIM_KERNEL < 0) ? 0 : xo - VP8_SSIM_KERNEL;
  const int xmax = (xo + VP8_SSIM_KERNEL > W - 1) ? W - 1
                                                  : xo + VP8_SSIM_KERNEL;
  int x, y;
  src1 += ymin * stride1;
  src2 += ymin * stride2;
  for (y = ymin; y <= ymax; ++y, src1 += stride1, src2 += stride2) {
    for (x = xmin; x <= xmax; ++x) {
      const uint32_t w = kWeight[VP8_SSIM_KERNEL + x - xo]
                       * kWeight[VP8_SSIM_KERNEL + y - yo];
      const uint32_t s1 = src1[x];
      const uint32_t s2 = src2[x];
      stats.w   += w;
      stats.xm  += w * s1;
      stats.ym  += w * s2;
      stats.xxm += w * s1 * s1;
      stats.xym += w * s1 * s2;
      stats.yym += w * s2 * s2;
    }
  }
  return VP8SSIMFromStatsClipped(&stats);
}